

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::VerifyCheckPadExplicitFreeList(Recycler *this,void *address,size_t size)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void *corruptedAddress;
  long lVar5;
  
  uVar1 = *(ulong *)((long)address + (size - 8));
  if (uVar1 == 0xcacacacacacacaca) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1edd,"(padding != (size_t)0xCACACACACACACACA)",
                       "padding != (size_t)0xCACACACACACACACA");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  corruptedAddress = (void *)((long)address + (size - 8));
  VerifyCheck((uint)(uVar1 < size && (ulong)this->verifyPad + 8 <= uVar1),L"Invalid padding size",
              address,corruptedAddress);
  if ((void *)((long)address + (size - uVar1)) < corruptedAddress) {
    lVar5 = -uVar1;
    do {
      VerifyCheck((uint)(*(char *)((long)address + lVar5 + size) == -0x36),L"buffer overflow",
                  address,(void *)((long)address + lVar5 + size));
      lVar5 = lVar5 + 1;
    } while (lVar5 != -8);
  }
  return;
}

Assistant:

void Recycler::VerifyCheckPadExplicitFreeList(void * address, size_t size)
{
    size_t * paddingAddress = (size_t *)((byte *)address + size - sizeof(size_t));
    size_t padding = *paddingAddress;

#pragma warning(suppress:4310)
    Assert(padding != (size_t)0xCACACACACACACACA);  // Explicit free objects have to have been initialized at some point before they were freed

    Recycler::VerifyCheck(padding >= verifyPad + sizeof(size_t) &&  padding < size, _u("Invalid padding size"), address, paddingAddress);
    for (byte * i = (byte *)address + size - padding; i < (byte *)paddingAddress; i++)
    {
        Recycler::VerifyCheck(*i == Recycler::VerifyMemFill, _u("buffer overflow"), address, i);
    }
}